

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::DistConstraintListSyntax::setChild
          (DistConstraintListSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *this_00;
  SeparatedSyntaxList<slang::syntax::DistItemSyntax> *pSVar1;
  logic_error *this_01;
  Token TVar2;
  string local_120;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  DistConstraintListSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar2._0_8_;
    (this->dist).kind = (undefined2)local_28;
    (this->dist).field_0x2 = local_28._2_1_;
    (this->dist).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->dist).rawLen = local_28._4_4_;
    local_20 = TVar2.info;
    (this->dist).info = local_20;
    break;
  case 1:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar2._0_8_;
    (this->openBrace).kind = (undefined2)local_38;
    (this->openBrace).field_0x2 = local_38._2_1_;
    (this->openBrace).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->openBrace).rawLen = local_38._4_4_;
    local_30 = TVar2.info;
    (this->openBrace).info = local_30;
    break;
  case 2:
    this_00 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>>
                       (this_00);
    SeparatedSyntaxList<slang::syntax::DistItemSyntax>::operator=(&this->items,pSVar1);
    break;
  case 3:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar2._0_8_;
    (this->closeBrace).kind = (undefined2)local_48;
    (this->closeBrace).field_0x2 = local_48._2_1_;
    (this->closeBrace).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->closeBrace).rawLen = local_48._4_4_;
    local_40 = TVar2.info;
    (this->closeBrace).info = local_40;
    break;
  default:
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_e9);
    std::operator+(&local_c8,&local_e8,":");
    std::__cxx11::to_string(&local_120,0x11c7);
    std::operator+(&local_a8,&local_c8,&local_120);
    std::operator+(&local_88,&local_a8,": ");
    std::operator+(&local_68,&local_88,"Default case should be unreachable!");
    std::logic_error::logic_error(this_01,(string *)&local_68);
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void DistConstraintListSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: dist = child.token(); return;
        case 1: openBrace = child.token(); return;
        case 2: items = child.node()->as<SeparatedSyntaxList<DistItemSyntax>>(); return;
        case 3: closeBrace = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}